

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_tokens(autobuf *out,char *section_name,char *entry_name,char *value,
                       cfg_schema_entry *entries,size_t entry_count,
                       cfg_schema_token_customizer *custom)

{
  int iVar1;
  size_t sVar2;
  char *src;
  ulong uVar3;
  long lVar4;
  char section_name_entry [32];
  char buffer [256];
  
  if (custom == (cfg_schema_token_customizer *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (ulong)custom->optional;
  }
  sVar2 = str_countwords(value);
  if ((sVar2 & 0xffffffff) < entry_count - uVar3) {
    cfg_append_printable_line
              (out,
               "Missing token for entry \'%s\' in section %s. At least %zu tokens expected. Tokens must be separated by whitespaces."
               ,entry_name,section_name,entry_count);
  }
  else {
    snprintf(section_name_entry,0x20,"%s.%s",section_name,entry_name);
    uVar3 = (ulong)((int)sVar2 - 1);
    lVar4 = 0;
    src = value;
    do {
      if (uVar3 * 200 + 200 == lVar4 + 200) {
        iVar1 = (*entries[uVar3].cb_validate)(entries + uVar3,section_name_entry,src,out);
        if (custom == (cfg_schema_token_customizer *)0x0) {
          return -(uint)(iVar1 != 0);
        }
        if (iVar1 != 0) {
          return -(uint)(iVar1 != 0);
        }
        if (custom->cb_validator !=
            (_func_int_autobuf_ptr_char_ptr_char_ptr_char_ptr_cfg_schema_entry_ptr_size_t *)0x0) {
          iVar1 = (*custom->cb_validator)(out,section_name,entry_name,value,entries,entry_count);
          return iVar1;
        }
        return 0;
      }
      src = str_cpynextword(buffer,src,0x100);
      iVar1 = (**(code **)((long)entries->validate_param + lVar4 + -0x10))
                        ((long)entries->validate_param + lVar4 + -0x80,section_name_entry,buffer,out
                        );
      lVar4 = lVar4 + 200;
    } while (iVar1 == 0);
  }
  return -1;
}

Assistant:

int
cfg_validate_tokens(struct autobuf *out, const char *section_name, const char *entry_name, const char *value,
  struct cfg_schema_entry *entries, size_t entry_count, struct cfg_schema_token_customizer *custom) {
  char buffer[256];
  char section_name_entry[32];
  const char *ptr;
  uint32_t parameter_count, optional;
  size_t i;

  optional = custom != NULL ? custom->optional : 0;

  parameter_count = str_countwords(value);
  if (parameter_count < entry_count - optional) {
    cfg_append_printable_line(out,
      "Missing token for entry '%s'"
      " in section %s. At least %" PRINTF_SIZE_T_SPECIFIER " tokens"
      " expected. Tokens must be separated by whitespaces.",
      entry_name, section_name, entry_count);
    return -1;
  }
  snprintf(section_name_entry, sizeof(section_name_entry), "%s.%s", section_name, entry_name);

  /* check each token */
  ptr = value;
  for (i = 0; i < parameter_count-1; i++) {
    ptr = str_cpynextword(buffer, ptr, sizeof(buffer));

    /* see if token is valid */
    if (entries[i].cb_validate(&entries[i], section_name_entry, buffer, out)) {
      return -1;
    }
  }

  /* see if the rest of the value is a valid "last" token */
  if (entries[parameter_count - 1].cb_validate(&entries[parameter_count - 1], section_name_entry, ptr, out)) {
    return -1;
  }

  if (custom && custom->cb_validator) {
    return custom->cb_validator(out, section_name, entry_name, value, entries, entry_count);
  }
  return 0;
}